

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

ExportedNames * __thiscall
Js::SourceTextModuleRecord::GetExportedNames
          (SourceTextModuleRecord *this,ExportModuleRecordList *exportStarSet)

{
  RealCount *pRVar1;
  Type *addr;
  IdentPtr pIVar2;
  code *pcVar3;
  SourceTextModuleRecord *pSVar4;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  bool bVar7;
  int iVar8;
  ArenaAllocator *pAVar9;
  ExportModuleRecordList *this_00;
  Type pSVar10;
  ExportedNames *this_01;
  undefined4 *puVar11;
  Type *pTVar12;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar13;
  Type *pTVar14;
  Iterator local_68;
  ArenaAllocator *local_58;
  SourceTextModuleRecord *local_50;
  SourceTextModuleRecord *moduleRecord;
  Iterator local_40;
  undefined4 extraout_var;
  
  this_01 = (this->exportedNames).ptr;
  if (this_01 == (ExportedNames *)0x0 || exportStarSet != (ExportModuleRecordList *)0x0) {
    pAVar9 = &((this->scriptContext).ptr)->generalAllocator;
    this_00 = exportStarSet;
    local_58 = pAVar9;
    if (exportStarSet == (ExportModuleRecordList *)0x0) {
      this_00 = (ExportModuleRecordList *)new<Memory::ArenaAllocator>(0x18,pAVar9,0x366bee);
      (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
      super_RealCount.count = 0;
      (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
      this_00->allocator = pAVar9;
    }
    bVar7 = SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Has
                      (&this_00->
                        super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>,
                       &this->super_ModuleRecordBase);
    if (bVar7) {
      this_01 = (ExportedNames *)0x0;
    }
    else {
      this_01 = (ExportedNames *)0x0;
      pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,this_00->allocator,0x366bee);
      pAVar9 = local_58;
      pSVar10[1].next = (Type)this;
      pSVar10->next =
           (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
      pRVar1 = &(this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>
                ).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      moduleRecord = this;
      pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               local_40.current;
      if ((this->localExportRecordList).ptr !=
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        this_01 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,local_58,0x366bee);
        (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0
        ;
        (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_01;
        this_01->allocator = pAVar9;
        local_40.list =
             &((this->localExportRecordList).ptr)->
              super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_40.current ==
              (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_00b136d0;
            *puVar11 = 0;
          }
          local_40.current =
               (((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_40.current == local_40.list) break;
          pTVar12 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data(&local_40);
          pIVar2 = pTVar12->exportName;
          iVar8 = pIVar2->m_propertyId;
          if (iVar8 == -1) {
            iVar8 = ScriptContext::GetOrAddPropertyIdTracked
                              ((moduleRecord->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,
                               pIVar2->m_cch);
            pIVar2->m_propertyId = iVar8;
          }
          pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,this_01->allocator,0x366bee);
          *(int *)&pSVar10[1].next = iVar8;
          pSVar10->next =
               (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
          pRVar1 = &(this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                    super_RealCount;
          pRVar1->count = pRVar1->count + 1;
        }
      }
      local_40.current = (NodeBase *)pSVar6;
      pSVar4 = moduleRecord;
      pAVar9 = local_58;
      pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               local_40.current;
      if ((moduleRecord->indirectExportRecordList).ptr !=
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        if (this_01 == (ExportedNames *)0x0) {
          this_01 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,local_58,0x366bee);
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
               0;
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_01;
          this_01->allocator = pAVar9;
        }
        local_40.list =
             &((pSVar4->indirectExportRecordList).ptr)->
              super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_40.current ==
              (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_00b136d0;
            *puVar11 = 0;
          }
          local_40.current =
               (((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_40.current == local_40.list) break;
          pTVar12 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data(&local_40);
          pIVar2 = pTVar12->exportName;
          iVar8 = pIVar2->m_propertyId;
          if (iVar8 == -1) {
            iVar8 = ScriptContext::GetOrAddPropertyIdTracked
                              ((moduleRecord->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,
                               pIVar2->m_cch);
            pIVar2->m_propertyId = iVar8;
          }
          pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,this_01->allocator,0x366bee);
          *(int *)&pSVar10[1].next = iVar8;
          pSVar10->next =
               (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
          pRVar1 = &(this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                    super_RealCount;
          pRVar1->count = pRVar1->count + 1;
        }
      }
      local_40.current = (NodeBase *)pSVar6;
      pSVar4 = moduleRecord;
      pAVar9 = local_58;
      if ((moduleRecord->starExportRecordList).ptr !=
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        if (this_01 == (ExportedNames *)0x0) {
          this_01 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,local_58,0x366bee);
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
               0;
          (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_01;
          this_01->allocator = pAVar9;
        }
        local_68.list =
             &((pSVar4->starExportRecordList).ptr)->
              super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
        local_68.current = &(local_68.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                 local_40.current;
        do {
          local_40.current = (NodeBase *)pSVar6;
          if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_68.current ==
              (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) {
LAB_00b136d0:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar11 = 0;
          }
          local_68.current =
               (((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                &(local_68.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_68.current == local_68.list) {
            local_68.current = (NodeBase *)0x0;
            break;
          }
          pTVar12 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data(&local_68);
          pIVar2 = pTVar12->moduleRequest;
          if (pIVar2 == (IdentPtr)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                        ,0x1fe,"(exportEntry.moduleRequest != nullptr)",
                                        "exportEntry.moduleRequest != nullptr");
            if (!bVar7) goto LAB_00b136d0;
            *puVar11 = 0;
          }
          local_50 = (SourceTextModuleRecord *)0x0;
          local_40.list =
               (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               &pIVar2->field_0x22;
          bVar7 = JsUtil::
                  BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::TryGetValue<char16_t_const*>
                            ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)(moduleRecord->childrenModuleSet).ptr,(char16_t **)&local_40,
                             &local_50);
          if (bVar7) {
            if (local_50->wasParsed == false) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x202,"(moduleRecord->WasParsed())",
                                          "moduleRecord->WasParsed()");
              if (!bVar7) goto LAB_00b136d0;
              *puVar11 = 0;
            }
            if (local_50->wasDeclarationInitialized == false) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x203,"(moduleRecord->WasDeclarationInitialized())",
                                          "moduleRecord->WasDeclarationInitialized()");
              if (!bVar7) goto LAB_00b136d0;
              *puVar11 = 0;
            }
            if ((local_50->super_ModuleRecordBase).wasEvaluated == true) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x204,"(!moduleRecord->WasEvaluated())",
                                          "!moduleRecord->WasEvaluated()");
              if (!bVar7) goto LAB_00b136d0;
              *puVar11 = 0;
            }
            iVar8 = (*(local_50->super_ModuleRecordBase).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])
                              (local_50,this_00);
            pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                      CONCAT44(extraout_var,iVar8);
            pSVar5 = pSVar13;
            pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                     local_40.current;
            if (pSVar13 !=
                (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              while( true ) {
                local_40.current = (NodeBase *)pSVar5;
                local_40.list =
                     &pSVar13->
                      super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
                if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                    local_40.current ==
                    (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                              ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar7) goto LAB_00b136d0;
                  *puVar11 = 0;
                }
                local_40.current =
                     (((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                      &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
                if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                    local_40.current == local_40.list) break;
                pTVar14 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                    ((Iterator *)&local_40);
                iVar8 = *pTVar14;
                pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                          local_40.list;
                pSVar5 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                         local_40.current;
                if ((iVar8 != 0x6e) &&
                   (bVar7 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Has
                                      (&this_01->
                                        super_SListBase<int,_Memory::ArenaAllocator,_RealCount>,
                                       iVar8),
                   pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                             local_40.list,
                   pSVar5 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                            local_40.current, !bVar7)) {
                  pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,this_01->allocator,0x366bee);
                  *(int *)&pSVar10[1].next = iVar8;
                  pSVar10->next =
                       (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                       super_SListNodeBase<Memory::ArenaAllocator>.next;
                  (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
                  pRVar1 = &(this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                            super_RealCount;
                  pRVar1->count = pRVar1->count + 1;
                  pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                            local_40.list;
                  pSVar5 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                           local_40.current;
                }
              }
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                        ,0x214,"(false)",
                                        "dependent modules should have been initialized");
            if (!bVar7) goto LAB_00b136d0;
            *puVar11 = 0;
            pSVar6 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                     local_40.current;
          }
        } while( true );
      }
      pSVar4 = moduleRecord;
      if (exportStarSet == (ExportModuleRecordList *)0x0) {
        addr = &moduleRecord->exportedNames;
        Memory::Recycler::WBSetBit((char *)addr);
        (pSVar4->exportedNames).ptr = this_01;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
    }
  }
  return this_01;
}

Assistant:

ExportedNames* SourceTextModuleRecord::GetExportedNames(ExportModuleRecordList* exportStarSet)
    {
        const bool isRootGetExportedNames = (exportStarSet == nullptr);

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames && exportedNames != nullptr)
        {
            return exportedNames;
        }

        ArenaAllocator* allocator = scriptContext->GeneralAllocator();

        if (exportStarSet == nullptr)
        {
            exportStarSet = Anew(allocator, ExportModuleRecordList, allocator);
        }
        if (exportStarSet->Has(this))
        {
            return nullptr;
        }
        exportStarSet->Prepend(this);

        ExportedNames* tempExportedNames = nullptr;
        if (this->localExportRecordList != nullptr)
        {
            tempExportedNames = Anew(allocator, ExportedNames, allocator);
            this->localExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportNameId);
            });
        }
        if (this->indirectExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->indirectExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportedNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportedNameId);
            });
        }
        if (this->starExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->starExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                Assert(exportEntry.moduleRequest != nullptr);
                SourceTextModuleRecord* moduleRecord = nullptr;
                if (this->childrenModuleSet->TryGetValue(exportEntry.moduleRequest->Psz(), &moduleRecord))
                {
                    Assert(moduleRecord->WasParsed());
                    Assert(moduleRecord->WasDeclarationInitialized()); // we should be half way during initialization
                    Assert(!moduleRecord->WasEvaluated());
                    ExportedNames* starExportedNames = moduleRecord->GetExportedNames(exportStarSet);
                    // We are not rejecting ambiguous resolution at this time.
                    if (starExportedNames != nullptr)
                    {
                        starExportedNames->Map([&](PropertyId propertyId) {
                            if (propertyId != PropertyIds::default_ && !tempExportedNames->Has(propertyId))
                            {
                                tempExportedNames->Prepend(propertyId);
                            }
                        });
                    }
                }
#if DBG
                else
                {
                    AssertMsg(false, "dependent modules should have been initialized");
                }
#endif
            });
        }

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames)
        {
            exportedNames = tempExportedNames;
        }

        return tempExportedNames;
    }